

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alc.cpp
# Opt level: O3

void alcGetIntegerv(ALCdevice *device,ALCenum param,ALCsizei size,ALCint *values)

{
  ALCdevice *in_RAX;
  span<int,_18446744073709551615UL> values_00;
  DeviceRef dev;
  ALCdevice *local_28;
  
  local_28 = in_RAX;
  VerifyDevice((ALCdevice *)&local_28);
  if (size < 1 || values == (ALCint *)0x0) {
    alcSetError(local_28,0xa004);
  }
  else {
    values_00.mDataEnd = values + (uint)size;
    values_00.mData = values;
    GetIntegerv(local_28,param,values_00);
  }
  if (local_28 != (ALCdevice *)0x0) {
    al::intrusive_ref<ALCdevice>::release(&local_28->super_intrusive_ref<ALCdevice>);
    return;
  }
  return;
}

Assistant:

ALC_API void ALC_APIENTRY alcGetIntegerv(ALCdevice *device, ALCenum param, ALCsizei size, ALCint *values)
START_API_FUNC
{
    DeviceRef dev{VerifyDevice(device)};
    if(size <= 0 || values == nullptr)
        alcSetError(dev.get(), ALC_INVALID_VALUE);
    else
        GetIntegerv(dev.get(), param, {values, static_cast<ALuint>(size)});
}